

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Glucose.cpp
# Opt level: O1

lbool __thiscall Gluco::Solver::search(Solver *this,int nof_conflicts)

{
  ClauseAllocator *this_00;
  byte bVar1;
  uint uVar2;
  uint *puVar3;
  uint *puVar4;
  lbool *plVar5;
  double dVar6;
  int64_t iVar7;
  int64_t iVar8;
  int64_t iVar9;
  bool bVar10;
  byte bVar11;
  CRef confl;
  uint uVar12;
  int iVar13;
  Lit p;
  ulong uVar14;
  int *piVar15;
  undefined8 extraout_RAX;
  ulong uVar16;
  undefined7 extraout_var;
  long lVar17;
  undefined7 uVar18;
  uint uVar19;
  int level;
  long lVar20;
  vec<int> *this_01;
  float fVar21;
  CRef cr;
  undefined4 local_dc;
  vec<Gluco::Lit> learnt_clause;
  vec<Gluco::Lit> selectors;
  uint szWoutSelectors;
  uint nblevels;
  int backtrack_level;
  ulong local_98;
  int *local_90;
  vec<int> *local_88;
  int *local_80;
  vec<unsigned_int> *local_78;
  ulong local_70;
  ulong local_68;
  ulong local_60;
  ulong local_58;
  long local_50;
  bqueue<unsigned_int> *local_48;
  bqueue<unsigned_int> *local_40;
  vec<Gluco::Lit> *local_38;
  
  if (this->ok == false) {
    __assert_fail("ok",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/Glucose.cpp"
                  ,0x410,"lbool Gluco::Solver::search(int)");
  }
  learnt_clause.data = (Lit *)0x0;
  learnt_clause.sz = 0;
  learnt_clause.cap = 0;
  selectors.data = (Lit *)0x0;
  selectors.sz = 0;
  selectors.cap = 0;
  this->starts = this->starts + 1;
  local_80 = &(this->trail).sz;
  local_40 = &this->trailQueue;
  local_90 = &(this->lbdQueue).first;
  local_48 = &this->lbdQueue;
  this_00 = &this->ca;
  local_78 = &this->learnts;
  local_38 = &this->conflict;
  this_01 = &this->trail_lim;
  local_dc = SUB84(local_38,0);
  local_98 = 0;
  local_88 = this_01;
  do {
    confl = propagate(this);
    if (confl == 0xffffffff) {
      if ((((this->conflictsRestarts != 0) &&
           (iVar13 = (this->lbdQueue).queuesize, iVar13 == (this->lbdQueue).maxsize)) &&
          ((double)(this->sumLBD / (float)this->conflictsRestarts) <
           (double)((this->lbdQueue).sumofqueue / (ulong)(long)iVar13 & 0xffffffff) * this->K)) ||
         ((this->pstop != (int *)0x0 && (*this->pstop != 0)))) {
        (this->lbdQueue).queuesize = 0;
        local_90[0] = 0;
        local_90[1] = 0;
        *(uint64_t *)(local_90 + 2) = 0;
        dVar6 = progressEstimate(this);
        this->progress_estimate = dVar6;
        iVar13 = (this->trail_lim).sz;
        level = (this->assumptions).sz;
        if (iVar13 < level) {
          level = iVar13;
        }
        if (this->incremental == 0) {
          level = 0;
        }
        cancelUntil(this,level);
        local_dc = (undefined4)CONCAT71((int7)((ulong)extraout_RAX >> 8),2);
        goto LAB_005b9de2;
      }
      if ((this->trail_lim).sz == 0) {
        bVar10 = simplify(this);
        uVar14 = CONCAT71(extraout_var,bVar10);
        if (!bVar10) goto LAB_005b9de0;
      }
      if (this->curRestart * (long)this->nbclausesbeforereduce <= this->conflicts) {
        if ((this->learnts).sz < 1) {
          __assert_fail("learnts.size()>0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/Glucose.cpp"
                        ,0x46a,"lbool Gluco::Solver::search(int)");
        }
        this->curRestart = this->conflicts / (long)this->nbclausesbeforereduce + 1;
        reduceDB(this);
        this->nbclausesbeforereduce = this->nbclausesbeforereduce + this->incReduceDB;
      }
      uVar12 = 0xfffffffe;
      do {
        iVar13 = (this->trail_lim).sz;
        p.x = uVar12;
        if ((this->assumptions).sz <= iVar13) goto LAB_005b9db7;
        plVar5 = (this->assigns).data;
        p.x = (this->assumptions).data[iVar13].x;
        bVar1 = plVar5[p.x >> 1].value;
        uVar18 = (undefined7)((ulong)plVar5 >> 8);
        bVar11 = (byte)p.x & 1;
        bVar10 = bVar1 == bVar11;
        if (bVar10) {
          cr = (this->trail).sz;
          vec<int>::push(this_01,(int *)&cr);
          iVar13 = 0;
          p.x = uVar12;
        }
        else {
          iVar13 = 8;
          if ((bVar1 ^ bVar11) == 1) {
            analyzeFinal(this,(Lit)(p.x ^ 1),local_38);
            iVar13 = 1;
            local_dc = (undefined4)CONCAT71(uVar18,1);
            p.x = uVar12;
          }
        }
        uVar12 = p.x;
      } while (iVar13 == 0);
      if (iVar13 == 8) {
LAB_005b9db7:
        if (p.x == 0xfffffffe) {
          this->decisions = this->decisions + 1;
          p = pickBranchLit(this);
          bVar10 = false;
          if (p.x == -2) {
            local_dc = 0;
            goto LAB_005b9de8;
          }
        }
        cr = (this->trail).sz;
        vec<int>::push(this_01,(int *)&cr);
        uncheckedEnqueue(this,p,0xffffffff);
        goto LAB_005b9cb6;
      }
    }
    else {
      lVar17 = this->conflicts + 1;
      this->conflicts = lVar17;
      this->conflictsRestarts = this->conflictsRestarts + 1;
      uVar14 = lVar17 * -0x2d77318fc504816f + 0x346dc5d6388658U >> 3 |
               lVar17 * -0x2d77318fc504816f << 0x3d;
      if ((uVar14 < 0xd1b71758e2197) && (this->var_decay < 0.95)) {
        this->var_decay = this->var_decay + 0.01;
      }
      if ((0 < this->verbosity) &&
         (uVar14 = lVar17 / (long)this->verbEveryConflicts,
         lVar17 % (long)this->verbEveryConflicts == 0)) {
        uVar14 = this->starts;
        local_50 = lVar17 / (long)uVar14;
        piVar15 = local_80;
        if ((this->trail_lim).sz != 0) {
          piVar15 = (this->trail_lim).data;
        }
        iVar7 = this->nbstopsrestarts;
        iVar8 = this->dec_vars;
        iVar13 = *piVar15;
        uVar12 = (this->clauses).sz;
        local_58 = (ulong)(uint)this->clauses_literals;
        local_60 = (ulong)(uint)this->nbReduceDB;
        local_68 = (ulong)(uint)(this->learnts).sz;
        iVar9 = this->nbRemovedClauses;
        local_70 = (ulong)(uint)this->nbDL2;
        dVar6 = progressEstimate(this);
        uVar12 = printf("c | %8d   %7d    %5d | %7d %8d %8d | %5d %8d   %6d %8d | %6.3f %% |\n",
                        SUB84(dVar6 * 100.0,0),uVar14 & 0xffffffff,(ulong)(uint)iVar7,local_50,
                        (ulong)(uint)((int)iVar8 - iVar13),(ulong)uVar12,local_58,local_60,local_68,
                        local_70,(ulong)(uint)iVar9);
        uVar14 = (ulong)uVar12;
        this_01 = local_88;
      }
      if ((this->trail_lim).sz == 0) {
LAB_005b9de0:
        local_dc = (undefined4)CONCAT71((int7)(uVar14 >> 8),1);
LAB_005b9de2:
        bVar10 = false;
      }
      else {
        bqueue<unsigned_int>::push(local_40,(this->trail).sz);
        if (((10000 < this->conflictsRestarts) &&
            ((this->lbdQueue).queuesize == (this->lbdQueue).maxsize)) &&
           ((double)((this->trailQueue).sumofqueue / (ulong)(long)(this->trailQueue).queuesize &
                    0xffffffff) * this->R < (double)(this->trail).sz)) {
          (this->lbdQueue).queuesize = 0;
          local_90[0] = 0;
          local_90[1] = 0;
          *(uint64_t *)(local_90 + 2) = 0;
          this->nbstopsrestarts = this->nbstopsrestarts + 1;
          if ((local_98 & 1) == 0) {
            this->lastblockatrestart = this->starts;
            this->nbstopsrestartssame = this->nbstopsrestartssame + 1;
            local_98 = CONCAT71((int7)((ulong)this->starts >> 8),1);
          }
        }
        if (learnt_clause.data != (Lit *)0x0) {
          learnt_clause._8_8_ = learnt_clause._8_8_ & 0xffffffff00000000;
        }
        if (selectors.data != (Lit *)0x0) {
          selectors._8_8_ = selectors._8_8_ & 0xffffffff00000000;
        }
        analyze(this,confl,&learnt_clause,&selectors,&backtrack_level,&nblevels,&szWoutSelectors);
        uVar12 = nblevels;
        bqueue<unsigned_int>::push(local_48,nblevels);
        this->sumLBD = (float)uVar12 + this->sumLBD;
        cancelUntil(this,backtrack_level);
        if (this->certifiedUNSAT == true) {
          if (0 < learnt_clause.sz) {
            lVar17 = 0;
            do {
              uVar19 = learnt_clause.data[lVar17].x >> 1;
              uVar2 = ~uVar19;
              if ((learnt_clause.data[lVar17].x & 1U) == 0) {
                uVar2 = uVar19 + 1;
              }
              fprintf((FILE *)this->certifiedOutput,"%i ",(ulong)uVar2);
              lVar17 = lVar17 + 1;
            } while (lVar17 < learnt_clause.sz);
          }
          fwrite("0\n",2,1,(FILE *)this->certifiedOutput);
          this_01 = local_88;
        }
        if (learnt_clause.sz == 1) {
          uncheckedEnqueue(this,(Lit)(learnt_clause.data)->x,0xffffffff);
          this->nbUn = this->nbUn + 1;
        }
        else {
          cr = ClauseAllocator::alloc<Gluco::vec<Gluco::Lit>>(this_00,&learnt_clause,true);
          if ((this->ca).super_RegionAllocator<unsigned_int>.sz <= cr) {
LAB_005b9e9f:
            __assert_fail("r >= 0 && r < sz",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/Alloc.h"
                          ,0x42,
                          "T &Gluco::RegionAllocator<unsigned int>::operator[](Ref) [T = unsigned int]"
                         );
          }
          puVar3 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
          *(ulong *)(puVar3 + cr) =
               *(ulong *)(puVar3 + cr) & 0xffffffff8000001f | (ulong)((uVar12 & 0x3ffffff) << 5);
          if ((this->ca).super_RegionAllocator<unsigned_int>.sz <= cr) goto LAB_005b9e9f;
          (this_00->super_RegionAllocator<unsigned_int>).memory[(ulong)cr + 2] = szWoutSelectors;
          if (uVar12 < 3) {
            this->nbDL2 = this->nbDL2 + 1;
          }
          if ((this->ca).super_RegionAllocator<unsigned_int>.sz <= cr) goto LAB_005b9e9f;
          if ((this_00->super_RegionAllocator<unsigned_int>).memory[(ulong)cr + 1] == 2) {
            this->nbBin = this->nbBin + 1;
          }
          vec<unsigned_int>::push(local_78,&cr);
          attachClause(this,cr);
          uVar14 = (ulong)cr;
          if ((this->ca).super_RegionAllocator<unsigned_int>.sz <= cr) goto LAB_005b9e9f;
          puVar3 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
          if ((*(ulong *)(puVar3 + uVar14) & 8) == 0) {
LAB_005b9e80:
            __assert_fail("header.has_extra",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/glucose/SolverTypes.h"
                          ,0xc4,"float &Gluco::Clause::activity()");
          }
          uVar16 = *(ulong *)(puVar3 + uVar14) >> 0x20;
          dVar6 = this->cla_inc;
          fVar21 = (float)((double)(float)puVar3[uVar14 + uVar16 + 3] + dVar6);
          puVar3[uVar14 + uVar16 + 3] = (uint)fVar21;
          if (1e+20 < fVar21) {
            lVar17 = (long)(this->learnts).sz;
            if (0 < lVar17) {
              puVar3 = (this->learnts).data;
              puVar4 = (this->ca).super_RegionAllocator<unsigned_int>.memory;
              uVar12 = (this->ca).super_RegionAllocator<unsigned_int>.sz;
              lVar20 = 0;
              do {
                uVar2 = puVar3[lVar20];
                if (uVar12 <= uVar2) goto LAB_005b9e9f;
                if ((*(ulong *)(puVar4 + uVar2) & 8) == 0) goto LAB_005b9e80;
                uVar14 = *(ulong *)(puVar4 + uVar2) >> 0x20;
                puVar4[(ulong)uVar2 + uVar14 + 3] =
                     (uint)((float)puVar4[(ulong)uVar2 + uVar14 + 3] * 1e-20);
                lVar20 = lVar20 + 1;
              } while (lVar17 != lVar20);
            }
            this->cla_inc = dVar6 * 1e-20;
          }
          uncheckedEnqueue(this,(Lit)(learnt_clause.data)->x,cr);
        }
        this->var_inc = (1.0 / this->var_decay) * this->var_inc;
        this->cla_inc = (1.0 / this->clause_decay) * this->cla_inc;
LAB_005b9cb6:
        bVar10 = true;
      }
    }
LAB_005b9de8:
    if (!bVar10) {
      if (selectors.data != (Lit *)0x0) {
        selectors._8_8_ = selectors._8_8_ & 0xffffffff00000000;
        free(selectors.data);
        selectors.data = (Lit *)0x0;
        selectors._8_8_ = selectors._8_8_ & 0xffffffff;
      }
      if (learnt_clause.data != (Lit *)0x0) {
        learnt_clause._8_8_ = learnt_clause._8_8_ & 0xffffffff00000000;
        free(learnt_clause.data);
      }
      return (lbool)(uint8_t)local_dc;
    }
  } while( true );
}

Assistant:

lbool Solver::search(int nof_conflicts)
{
    assert(ok);
    int         backtrack_level;
    int         conflictC = 0;
    vec<Lit>    learnt_clause,selectors;
    unsigned int nblevels,szWoutSelectors;
    bool blocked=false;
    starts++;
    for (;;){
        CRef confl = propagate();
        if (confl != CRef_Undef){
            // CONFLICT
          conflicts++; conflictC++;conflictsRestarts++;
          if(conflicts%5000==0 && var_decay<0.95)
            var_decay += 0.01;

          if (verbosity >= 1 && conflicts%verbEveryConflicts==0){
            printf("c | %8d   %7d    %5d | %7d %8d %8d | %5d %8d   %6d %8d | %6.3f %% |\n", 
                   (int)starts,(int)nbstopsrestarts, (int)(conflicts/starts), 
                   (int)dec_vars - (trail_lim.size() == 0 ? trail.size() : trail_lim[0]), nClauses(), (int)clauses_literals, 
                   (int)nbReduceDB, nLearnts(), (int)nbDL2,(int)nbRemovedClauses, progressEstimate()*100);
          }
          if (decisionLevel() == 0) {
            return l_False;
            
          }

          trailQueue.push(trail.size());
          // BLOCK RESTART (CP 2012 paper)
          if( conflictsRestarts>LOWER_BOUND_FOR_BLOCKING_RESTART && lbdQueue.isvalid()  && trail.size()>R*trailQueue.getavg()) {
            lbdQueue.fastclear();
            nbstopsrestarts++;
            if(!blocked) {lastblockatrestart=starts;nbstopsrestartssame++;blocked=true;}
          }

            learnt_clause.clear();
            selectors.clear();
            analyze(confl, learnt_clause, selectors,backtrack_level,nblevels,szWoutSelectors);

            lbdQueue.push(nblevels);
            sumLBD += nblevels;
 
            cancelUntil(backtrack_level);

            if (certifiedUNSAT) {
              for (int i = 0; i < learnt_clause.size(); i++)
                fprintf(certifiedOutput, "%i " , (var(learnt_clause[i]) + 1) *
                            (-2 * sign(learnt_clause[i]) + 1) );
              fprintf(certifiedOutput, "0\n");
            }

            if (learnt_clause.size() == 1){
              uncheckedEnqueue(learnt_clause[0]);nbUn++;
            }else{
                CRef cr = ca.alloc(learnt_clause, true);
                ca[cr].setLBD(nblevels); 
                ca[cr].setSizeWithoutSelectors(szWoutSelectors);
                if(nblevels<=2) nbDL2++; // stats
                if(ca[cr].size()==2) nbBin++; // stats
                learnts.push(cr);
                attachClause(cr);

                claBumpActivity(ca[cr]);
                uncheckedEnqueue(learnt_clause[0], cr);
            }
            varDecayActivity();
            claDecayActivity();

           
        }else{

          // Our dynamic restart, see the SAT09 competition compagnion paper 
          if ( (conflictsRestarts && lbdQueue.isvalid() && lbdQueue.getavg()*K > sumLBD/conflictsRestarts) || (pstop && *pstop) ) {
            lbdQueue.fastclear();
            progress_estimate = progressEstimate();
            int bt = 0;
            if(incremental) { // DO NOT BACKTRACK UNTIL 0.. USELESS
              bt = (decisionLevel()<assumptions.size()) ? decisionLevel() : assumptions.size();
            }
            cancelUntil(bt);
            return l_Undef; 
          }

           // Simplify the set of problem clauses:
          if (decisionLevel() == 0 && !simplify()) {
            return l_False;
          }
            // Perform clause database reduction !
            if(conflicts>=curRestart* nbclausesbeforereduce) 
              {
                  
                assert(learnts.size()>0);
                curRestart = (conflicts/ nbclausesbeforereduce)+1;
                reduceDB();
                nbclausesbeforereduce += incReduceDB;
              }

            Lit next = lit_Undef;
            while (decisionLevel() < assumptions.size()){
                // Perform user provided assumption:
                Lit p = assumptions[decisionLevel()];
                if (value(p) == l_True){
                    // Dummy decision level:
                    newDecisionLevel();
                }else if (value(p) == l_False){
                    analyzeFinal(~p, conflict);
                    return l_False;
                }else{
                    next = p;
                    break;
                }
            }

            if (next == lit_Undef){
                // New variable decision:
                decisions++;
                next = pickBranchLit();

                if (next == lit_Undef){
                  //printf("c last restart ## conflicts  :  %d %d \n",conflictC,decisionLevel());
                  // Model found:
                  return l_True;
                }
            }

            // Increase decision level and enqueue 'next'
            newDecisionLevel();
            uncheckedEnqueue(next);
        }
    }
}